

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levinson_durbin_recursion.cc
# Opt level: O3

bool __thiscall
sptk::LevinsonDurbinRecursion::Run
          (LevinsonDurbinRecursion *this,vector<double,_std::allocator<double>_> *autocorrelation,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,bool *is_stable,
          Buffer *buffer)

{
  int iVar1;
  double *pdVar2;
  pointer pdVar3;
  bool bVar4;
  double *pdVar5;
  uint uVar6;
  size_type __new_size;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  int j;
  double *pdVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar4 = false;
  if (((buffer != (Buffer *)0x0) && (bVar4 = false, is_stable != (bool *)0x0)) &&
     (bVar4 = false,
     linear_predictive_coefficients != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar1 = this->num_order_;
    uVar6 = iVar1 + 1;
    lVar11 = (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    __new_size = lVar11 >> 3;
    if (__new_size == (long)(int)uVar6) {
      if ((long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>
                )._M_impl.super__Vector_impl_data._M_start != lVar11) {
        std::vector<double,_std::allocator<double>_>::resize
                  (linear_predictive_coefficients,__new_size);
      }
      pdVar5 = (buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar5 != lVar11) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->c_,__new_size);
        pdVar5 = (buffer->c_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      *is_stable = true;
      pdVar2 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      *pdVar3 = 0.0;
      dVar13 = *pdVar2;
      if (dVar13 == 0.0) {
LAB_0010513b:
        bVar4 = false;
      }
      else {
        if (0 < iVar1) {
          lVar11 = 2;
          uVar7 = 1;
          lVar8 = 0;
          pdVar9 = pdVar5;
          do {
            dVar14 = -pdVar2[uVar7];
            pdVar10 = pdVar5 + 1;
            lVar12 = lVar8;
            if (1 < uVar7) {
              do {
                dVar14 = dVar14 - *pdVar10 * *(double *)((long)pdVar2 + lVar12);
                pdVar10 = pdVar10 + 1;
                lVar12 = lVar12 + -8;
              } while (lVar12 != 0);
            }
            dVar14 = dVar14 / dVar13;
            if (1.0 <= ABS(dVar14)) {
              *is_stable = false;
            }
            if (1 < uVar7) {
              lVar12 = 0;
              pdVar10 = pdVar9;
              do {
                *(double *)((long)pdVar3 + lVar12 + 8) =
                     *pdVar10 * dVar14 + *(double *)((long)(pdVar5 + 1) + lVar12);
                pdVar10 = pdVar10 + -1;
                lVar12 = lVar12 + 8;
              } while (lVar8 != lVar12);
            }
            pdVar3[uVar7] = dVar14;
            dVar13 = dVar13 * (1.0 - dVar14 * dVar14);
            if (dVar13 == 0.0) goto LAB_0010513b;
            lVar12 = 0;
            do {
              pdVar5[lVar12] = pdVar3[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar11 != lVar12);
            uVar7 = uVar7 + 1;
            lVar11 = lVar11 + 1;
            lVar8 = lVar8 + 8;
            pdVar9 = pdVar9 + 1;
          } while (uVar7 != uVar6);
        }
        if (dVar13 < 0.0) {
          dVar13 = sqrt(dVar13);
        }
        else {
          dVar13 = SQRT(dVar13);
        }
        *pdVar3 = dVar13;
        bVar4 = true;
      }
    }
  }
  return bVar4;
}

Assistant:

bool LevinsonDurbinRecursion::Run(
    const std::vector<double>& autocorrelation,
    std::vector<double>* linear_predictive_coefficients, bool* is_stable,
    LevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      autocorrelation.size() != static_cast<std::size_t>(length) ||
      NULL == linear_predictive_coefficients || NULL == is_stable ||
      NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (linear_predictive_coefficients->size() !=
      static_cast<std::size_t>(length)) {
    linear_predictive_coefficients->resize(length);
  }
  if (buffer->c_.size() != static_cast<std::size_t>(length)) {
    buffer->c_.resize(length);
  }

  *is_stable = true;

  const double* r(&(autocorrelation[0]));
  double* a(&((*linear_predictive_coefficients)[0]));
  double* c(&buffer->c_[0]);

  // Set initial condition.
  a[0] = 0.0;
  double e(r[0]);
  if (0.0 == e || std::isnan(e)) {
    return false;
  }

  // Perform Durbin's iterative algorithm.
  for (int i(1); i < length; ++i) {
    double k(-r[i]);
    for (int j(1); j < i; ++j) {
      k -= c[j] * r[i - j];
    }
    k /= e;

    if (1.0 <= std::fabs(k)) {
      *is_stable = false;
    }

    for (int j(1); j < i; ++j) {
      a[j] = c[j] + k * c[i - j];
    }
    a[i] = k;

    e *= 1.0 - k * k;
    if (0.0 == e || std::isnan(e)) {
      return false;
    }

    for (int j(0); j <= i; ++j) {
      c[j] = a[j];
    }
  }

  // Set gain.
  a[0] = std::sqrt(e);

  return true;
}